

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-gtest-all.cc
# Opt level: O0

string * testing::FormatWordList
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *words)

{
  size_type sVar1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RSI;
  string *in_RDI;
  size_t i;
  Message word_list;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff98;
  Message *in_stack_ffffffffffffffa0;
  Message *in_stack_ffffffffffffffa8;
  Message *in_stack_ffffffffffffffd0;
  undefined8 local_20;
  
  Message::Message(in_stack_ffffffffffffffd0);
  local_20 = 0;
  while( true ) {
    sVar1 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(in_RSI);
    if (sVar1 <= local_20) break;
    if (local_20 != 0) {
      sVar1 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size(in_RSI);
      if (2 < sVar1) {
        Message::operator<<(in_stack_ffffffffffffffa0,(char (*) [3])in_stack_ffffffffffffff98);
      }
    }
    sVar1 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(in_RSI);
    if (local_20 == sVar1 - 1) {
      Message::operator<<(in_stack_ffffffffffffffa0,(char (*) [5])in_stack_ffffffffffffff98);
    }
    in_stack_ffffffffffffffa8 =
         Message::operator<<(in_stack_ffffffffffffffa0,(char (*) [2])in_stack_ffffffffffffff98);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[](in_RSI,local_20);
    in_stack_ffffffffffffffa0 =
         Message::operator<<(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    Message::operator<<(in_stack_ffffffffffffffa0,(char (*) [2])in_stack_ffffffffffffff98);
    local_20 = local_20 + 1;
  }
  Message::GetString_abi_cxx11_(in_stack_ffffffffffffffa8);
  Message::~Message((Message *)0x129685);
  return in_RDI;
}

Assistant:

static std::string FormatWordList(const std::vector<std::string>& words) {
  Message word_list;
  for (size_t i = 0; i < words.size(); ++i) {
    if (i > 0 && words.size() > 2) {
      word_list << ", ";
    }
    if (i == words.size() - 1) {
      word_list << "and ";
    }
    word_list << "'" << words[i] << "'";
  }
  return word_list.GetString();
}